

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdCreateExtkeyFromSeed(void *handle,char *seed_hex,int network_type,int key_type,char **extkey)

{
  bool bVar1;
  NetType net_type;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  HDWalletApi api;
  string key;
  bool local_8b;
  allocator local_8a;
  HDWalletApi local_89;
  undefined1 local_88 [32];
  ByteData local_68;
  string local_50;
  
  cfd::Initialize();
  if (extkey == (char **)0x0) {
    local_88._0_8_ = "cfdcapi_key.cpp";
    local_88._8_4_ = 0x680;
    local_88._16_8_ = "CfdCreateExtkeyFromSeed";
    cfd::core::logger::log<>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"extkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Failed to parameter. extkey is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(seed_hex);
  if (!bVar1) {
    local_8b = true;
    net_type = cfd::capi::ConvertNetType(network_type,&local_8b);
    if (local_8b != false) {
      std::__cxx11::string::string((string *)&local_50,seed_hex,&local_8a);
      cfd::core::ByteData::ByteData(&local_68,&local_50);
      cfd::api::HDWalletApi::CreateExtkeyFromSeed_abi_cxx11_
                ((string *)local_88,&local_89,&local_68,net_type,key_type);
      if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pcVar2 = cfd::capi::CreateString((string *)local_88);
      *extkey = pcVar2;
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_);
      }
      return 0;
    }
    local_88._0_8_ = "cfdcapi_key.cpp";
    local_88._8_4_ = 0x68f;
    local_88._16_8_ = "CfdCreateExtkeyFromSeed";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_88,kCfdLogLevelWarning,
               "privkey\'s network_type is invalid.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Failed to parameter. privkey\'s network_type is invalid.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_88._0_8_ = "cfdcapi_key.cpp";
  local_88._8_4_ = 0x686;
  local_88._16_8_ = "CfdCreateExtkeyFromSeed";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"seed is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"Failed to parameter. seed is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_88);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateExtkeyFromSeed(
    void* handle, const char* seed_hex, int network_type, int key_type,
    char** extkey) {
  try {
    cfd::Initialize();
    if (extkey == nullptr) {
      warn(CFD_LOG_SOURCE, "extkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null.");
    }
    if (IsEmptyString(seed_hex)) {
      warn(CFD_LOG_SOURCE, "seed is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. seed is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    ExtKeyType output_key_type = static_cast<ExtKeyType>(key_type);
    HDWalletApi api;
    std::string key = api.CreateExtkeyFromSeed(
        ByteData(seed_hex), net_type, output_key_type);
    *extkey = CreateString(key);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}